

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

int mdns_socket_open_ipv6(void)

{
  int iVar1;
  int local_c;
  int sock;
  
  local_c = socket(10,2,0x11);
  if (local_c < 0) {
    local_c = -1;
  }
  else {
    iVar1 = mdns_socket_setup_ipv6(local_c);
    if (iVar1 != 0) {
      mdns_socket_close(local_c);
      local_c = -1;
    }
  }
  return local_c;
}

Assistant:

int
mdns_socket_open_ipv6(void) {
	int sock = (int)socket(AF_INET6, SOCK_DGRAM, IPPROTO_UDP);
	if (sock < 0)
		return -1;
	if (mdns_socket_setup_ipv6(sock)) {
		mdns_socket_close(sock);
		return -1;
	}
	return sock;
}